

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Slice_x86_avx::forward
          (Slice_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  int _elempack;
  Mat *src;
  ulong _elemsize;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  pointer pMVar7;
  pointer pMVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  void *pvVar13;
  long lVar14;
  pointer pMVar15;
  ulong extraout_RDX;
  long lVar16;
  void *pvVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  void *pvVar21;
  int iVar22;
  long lVar23;
  void *pvVar24;
  void *pvVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  void *pvVar30;
  undefined4 *puVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  void *pvVar35;
  int *piVar36;
  void *pvVar37;
  ulong uVar38;
  long lVar39;
  void *pvVar40;
  undefined1 local_c8 [56];
  int local_90;
  size_t local_88;
  uint local_74;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  pointer local_40;
  long local_38;
  
  src = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  uVar1 = src->dims;
  uVar5 = (ulong)uVar1;
  _elemsize = src->elemsize;
  _elempack = src->elempack;
  uVar4 = (ulong)_elempack;
  lVar20 = *(long *)(&this->field_0xd0 + (long)this->_vptr_Slice_x86_avx[-3]);
  iVar9 = (*(int *)(&this->field_0x118 + (long)this->_vptr_Slice_x86_avx[-3]) >> 0x1f & uVar1) +
          *(int *)(&this->field_0x118 + (long)this->_vptr_Slice_x86_avx[-3]);
  if (uVar1 == 1) {
    pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar7;
    if (lVar11 == 0) {
      uVar5 = 0;
      goto LAB_003655b0;
    }
    iVar32 = src->w;
    uVar12 = (lVar11 >> 3) * -0x71c71c71c71c71c7;
    lVar34 = 0;
    lVar11 = 0;
    iVar18 = 0;
    uVar38 = 0;
    do {
      uVar10 = *(uint *)(lVar20 + uVar38 * 4);
      uVar5 = (ulong)uVar10;
      if (uVar10 == 0xffffff17) {
        uVar5 = (ulong)(long)(iVar32 * _elempack - iVar18) / (uVar12 + lVar11);
      }
      uVar10 = 1;
      if ((opt->use_packing_layout == true) &&
         (uVar10 = (uint)((uVar5 & 3) == 0) * 3 + 1, (uVar5 & 7) == 0)) {
        uVar10 = 8;
      }
      Mat::create((Mat *)((long)&pMVar7->data + lVar34),
                  (int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) /
                       (long)(int)uVar10),(ulong)uVar10 * (_elemsize / uVar4),uVar10,
                  opt->blob_allocator);
      pvVar35 = *(void **)((long)&pMVar7->data + lVar34);
      if (pvVar35 == (void *)0x0) {
        return -100;
      }
      if ((long)*(int *)((long)&pMVar7->c + lVar34) * *(long *)((long)&pMVar7->cstep + lVar34) == 0)
      {
        return -100;
      }
      memcpy(pvVar35,(void *)((long)iVar18 * 4 + (long)src->data),
             (long)*(int *)((long)&pMVar7->w + lVar34) * *(long *)((long)&pMVar7->elemsize + lVar34)
            );
      iVar18 = iVar18 + (int)uVar5;
      uVar38 = uVar38 + 1;
      pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar12 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)pMVar7 >> 3) * -0x71c71c71c71c71c7;
      lVar11 = lVar11 + -1;
      lVar34 = lVar34 + 0x48;
      uVar5 = extraout_RDX;
    } while (uVar38 < uVar12);
  }
  uVar5 = CONCAT71((int7)(uVar5 >> 8),uVar1 == 2);
  if ((uVar1 == 2) && (iVar9 == 0)) {
    local_74 = (uint)uVar5;
    pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar5 = ((long)pMVar8 - (long)pMVar7 >> 3) * -0x71c71c71c71c71c7;
    iVar32 = src->w;
    if (pMVar8 != pMVar7) {
      iVar18 = src->h;
      lVar34 = 0;
      lVar11 = 0;
      iVar22 = 0;
      uVar12 = 0;
      do {
        uVar10 = *(uint *)(lVar20 + uVar12 * 4);
        uVar38 = (ulong)uVar10;
        if (uVar10 == 0xffffff17) {
          uVar38 = (ulong)(long)(iVar18 * _elempack - iVar22) / (uVar5 + lVar11);
        }
        lVar27 = 1;
        if ((opt->use_packing_layout == true) &&
           (lVar27 = (ulong)((uVar38 & 3) == 0) * 3 + 1, (uVar38 & 7) == 0)) {
          lVar27 = 8;
        }
        Mat::create((Mat *)((long)&pMVar7->data + lVar34),iVar32,
                    (int)((long)((ulong)(uint)((int)uVar38 >> 0x1f) << 0x20 | uVar38 & 0xffffffff) /
                         (long)(int)lVar27),lVar27 * (_elemsize / uVar4),(int)lVar27,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar7->data + lVar34) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar7->c + lVar34) * *(long *)((long)&pMVar7->cstep + lVar34) ==
            0) {
          return -100;
        }
        iVar22 = iVar22 + (int)uVar38;
        uVar12 = uVar12 + 1;
        pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        uVar5 = ((long)pMVar8 - (long)pMVar7 >> 3) * -0x71c71c71c71c71c7;
        lVar11 = lVar11 + -1;
        lVar34 = lVar34 + 0x48;
      } while (uVar12 < uVar5);
    }
    iVar18 = pMVar7->elempack;
    if (pMVar8 != pMVar7) {
      lVar11 = uVar5 + (uVar5 == 0);
      piVar36 = &pMVar7->elempack;
      do {
        if (*piVar36 < iVar18) {
          iVar18 = *piVar36;
        }
        piVar36 = piVar36 + 0x12;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
    }
    piVar36 = src->refcount;
    local_c8._0_8_ = src->data;
    local_c8._8_8_ = src->refcount;
    local_c8._16_8_ = src->elemsize;
    local_c8._24_4_ = src->elempack;
    local_c8._32_8_ = src->allocator;
    local_c8._40_4_ = src->dims;
    local_c8._44_4_ = src->w;
    local_c8._48_4_ = src->h;
    local_c8._52_4_ = src->d;
    local_90 = src->c;
    local_88 = src->cstep;
    if (piVar36 != (int *)0x0) {
      LOCK();
      *piVar36 = *piVar36 + 1;
      UNLOCK();
    }
    if (iVar18 < _elempack) {
      convert_packing(src,(Mat *)local_c8,iVar18,opt);
    }
    pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pMVar8 != pMVar7) {
      local_38 = (long)iVar32;
      lVar27 = (long)(iVar32 * 8) * 4;
      lVar11 = (long)(iVar32 * 4) * 4;
      lVar34 = (long)(iVar32 * 4) * 4;
      local_70 = local_38 * 4;
      local_60 = (long)(iVar32 * 2) << 2;
      local_68 = (long)(iVar32 * 3) << 2;
      local_48 = (long)(iVar32 * 5) << 2;
      local_50 = (long)(iVar32 * 6) << 2;
      local_58 = (long)(iVar32 * 7) << 2;
      uVar5 = 0;
      pvVar35 = (void *)local_c8._0_8_;
      do {
        pMVar15 = pMVar7 + uVar5;
        iVar22 = pMVar15->elempack;
        if ((iVar18 == 4) && (iVar22 == 8)) {
          iVar22 = pMVar15->h;
          if (0 < (long)iVar22) {
            pvVar13 = pMVar15->data;
            iVar19 = pMVar15->w;
            sVar2 = pMVar15->elemsize;
            lVar23 = 0;
            do {
              if (0 < iVar32) {
                lVar28 = 0;
                iVar26 = iVar32;
                do {
                  *(undefined4 *)((long)pvVar13 + lVar28 * 2) =
                       *(undefined4 *)((long)pvVar35 + lVar28);
                  *(undefined4 *)((long)pvVar13 + lVar28 * 2 + 4) =
                       *(undefined4 *)((long)pvVar35 + lVar28 + 4);
                  *(undefined4 *)((long)pvVar13 + lVar28 * 2 + 8) =
                       *(undefined4 *)((long)pvVar35 + lVar28 + 8);
                  *(undefined4 *)((long)pvVar13 + lVar28 * 2 + 0xc) =
                       *(undefined4 *)((long)pvVar35 + lVar28 + 0xc);
                  *(undefined4 *)((long)pvVar13 + lVar28 * 2 + 0x10) =
                       *(undefined4 *)((long)pvVar35 + lVar28 + lVar11);
                  *(undefined4 *)((long)pvVar13 + lVar28 * 2 + 0x14) =
                       *(undefined4 *)((long)pvVar35 + lVar28 + lVar11 + 4);
                  *(undefined4 *)((long)pvVar13 + lVar28 * 2 + 0x18) =
                       *(undefined4 *)((long)pvVar35 + lVar28 + lVar11 + 8);
                  *(undefined4 *)((long)pvVar13 + lVar28 * 2 + 0x1c) =
                       *(undefined4 *)((long)pvVar35 + lVar28 + lVar11 + 0xc);
                  lVar28 = lVar28 + 0x10;
                  iVar26 = iVar26 + -1;
                } while (iVar26 != 0);
              }
              pvVar35 = (void *)((long)pvVar35 + lVar27);
              lVar23 = lVar23 + 1;
              pvVar13 = (void *)((long)pvVar13 + (long)iVar19 * sVar2);
            } while (lVar23 != iVar22);
            iVar22 = pMVar15->elempack;
            goto LAB_003652aa;
          }
LAB_003654df:
          iVar22 = 8;
        }
        else {
LAB_003652aa:
          if ((iVar18 == 1) && (iVar22 == 8)) {
            iVar22 = pMVar15->h;
            if ((long)iVar22 < 1) goto LAB_003654df;
            pvVar24 = pMVar15->data;
            iVar19 = pMVar15->w;
            lVar23 = (long)pvVar35 + local_70;
            lVar28 = (long)pvVar35 + local_60;
            lVar29 = (long)pvVar35 + local_68;
            pvVar13 = (void *)((long)pvVar35 + lVar34);
            lVar39 = (long)pvVar35 + local_48;
            lVar14 = (long)pvVar35 + local_50;
            lVar6 = local_58 + (long)pvVar35;
            sVar2 = pMVar15->elemsize;
            lVar33 = 0;
            do {
              if (0 < iVar32) {
                lVar16 = 0;
                iVar26 = iVar32;
                do {
                  *(undefined4 *)((long)pvVar24 + lVar16 * 8) =
                       *(undefined4 *)((long)pvVar35 + lVar16);
                  *(undefined4 *)((long)pvVar24 + lVar16 * 8 + 4) = *(undefined4 *)(lVar23 + lVar16)
                  ;
                  *(undefined4 *)((long)pvVar24 + lVar16 * 8 + 8) = *(undefined4 *)(lVar28 + lVar16)
                  ;
                  *(undefined4 *)((long)pvVar24 + lVar16 * 8 + 0xc) =
                       *(undefined4 *)(lVar29 + lVar16);
                  *(undefined4 *)((long)pvVar24 + lVar16 * 8 + 0x10) =
                       *(undefined4 *)((long)pvVar13 + lVar16);
                  *(undefined4 *)((long)pvVar24 + lVar16 * 8 + 0x14) =
                       *(undefined4 *)(lVar39 + lVar16);
                  *(undefined4 *)((long)pvVar24 + lVar16 * 8 + 0x18) =
                       *(undefined4 *)(lVar14 + lVar16);
                  *(undefined4 *)((long)pvVar24 + lVar16 * 8 + 0x1c) =
                       *(undefined4 *)(lVar6 + lVar16);
                  lVar16 = lVar16 + 4;
                  iVar26 = iVar26 + -1;
                } while (iVar26 != 0);
              }
              pvVar35 = (void *)((long)pvVar35 + lVar27);
              lVar33 = lVar33 + 1;
              lVar23 = lVar23 + lVar27;
              lVar28 = lVar28 + lVar27;
              lVar29 = lVar29 + lVar27;
              pvVar13 = (void *)((long)pvVar13 + lVar27);
              lVar39 = lVar39 + lVar27;
              lVar14 = lVar14 + lVar27;
              lVar6 = lVar6 + lVar27;
              pvVar24 = (void *)((long)pvVar24 + (long)iVar19 * sVar2);
            } while (lVar33 != iVar22);
            iVar22 = pMVar15->elempack;
            local_40 = pMVar7;
          }
          if ((iVar18 == 1) && (iVar22 == 4)) {
            iVar19 = pMVar15->h;
            if ((long)iVar19 < 1) {
              iVar22 = 4;
            }
            else {
              pvVar13 = pMVar15->data;
              iVar26 = pMVar15->w;
              sVar2 = pMVar15->elemsize;
              lVar23 = local_68 + (long)pvVar35;
              lVar28 = local_60 + (long)pvVar35;
              lVar29 = local_70 + (long)pvVar35;
              lVar39 = 0;
              do {
                if (0 < iVar32) {
                  puVar31 = (undefined4 *)((long)iVar26 * sVar2 * lVar39 + (long)pvVar13);
                  lVar14 = 0;
                  do {
                    *puVar31 = *(undefined4 *)((long)pvVar35 + lVar14 * 4);
                    puVar31[1] = *(undefined4 *)(lVar29 + lVar14 * 4);
                    puVar31[2] = *(undefined4 *)(lVar28 + lVar14 * 4);
                    puVar31[3] = *(undefined4 *)(lVar23 + lVar14 * 4);
                    puVar31 = puVar31 + 4;
                    lVar14 = lVar14 + 1;
                  } while (iVar32 != (int)lVar14);
                }
                pvVar35 = (void *)((long)pvVar35 + lVar34);
                lVar39 = lVar39 + 1;
                lVar23 = lVar23 + lVar34;
                lVar28 = lVar28 + lVar34;
                lVar29 = lVar29 + lVar34;
              } while (lVar39 != iVar19);
            }
          }
        }
        if (iVar18 == iVar22) {
          lVar23 = pMVar15->h * local_38;
          memcpy(pMVar15->data,pvVar35,pMVar15->elemsize * lVar23);
          pvVar35 = (void *)((long)pvVar35 + (long)(int)lVar23 * (long)pMVar15->elempack * 4);
          pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)(((long)pMVar8 - (long)pMVar7 >> 3) * -0x71c71c71c71c71c7));
    }
    if ((int *)local_c8._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_c8._8_8_ = *(int *)local_c8._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_c8._8_8_ == 0) {
        if ((Allocator *)local_c8._32_8_ == (Allocator *)0x0) {
          if ((void *)local_c8._0_8_ != (void *)0x0) {
            free((void *)local_c8._0_8_);
          }
        }
        else {
          (*(*(_func_int ***)local_c8._32_8_)[3])();
        }
      }
    }
    uVar5 = (ulong)local_74;
  }
LAB_003655b0:
  if (((char)uVar5 != '\0') && (iVar9 == 1)) {
    uVar10 = src->h;
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)pMVar7 - (long)pMVar8 != 0) {
      iVar32 = src->w;
      uVar5 = ((long)pMVar7 - (long)pMVar8 >> 3) * -0x71c71c71c71c71c7;
      lVar34 = 0;
      lVar11 = 0;
      uVar12 = 0;
      iVar18 = 0;
      do {
        iVar22 = *(int *)(lVar20 + uVar12 * 4);
        if (iVar22 == -0xe9) {
          iVar22 = (int)((ulong)((long)iVar32 - (long)iVar18) / (uVar5 + lVar11));
        }
        Mat::create((Mat *)((long)&pMVar8->data + lVar34),iVar22,uVar10,_elemsize,_elempack,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar8->data + lVar34) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar8->c + lVar34) * *(long *)((long)&pMVar8->cstep + lVar34) ==
            0) {
          return -100;
        }
        iVar18 = iVar18 + iVar22;
        uVar12 = uVar12 + 1;
        pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        uVar5 = ((long)pMVar7 - (long)pMVar8 >> 3) * -0x71c71c71c71c71c7;
        lVar11 = lVar11 + -1;
        lVar34 = lVar34 + 0x48;
      } while (uVar12 < uVar5);
    }
    if (0 < (int)uVar10) {
      uVar5 = 0;
      do {
        pMVar15 = pMVar8;
        if (pMVar7 != pMVar8) {
          pvVar35 = (void *)((long)src->w * uVar5 * src->elemsize + (long)src->data);
          lVar11 = 0x2c;
          uVar12 = 0;
          do {
            lVar34 = (long)*(int *)((long)&pMVar15->data + lVar11);
            memcpy((void *)(uVar5 * lVar34 * *(long *)((long)pMVar15 + lVar11 + -0x1c) +
                           *(long *)((long)pMVar15 + lVar11 + -0x2c)),pvVar35,lVar34 * _elemsize);
            pvVar35 = (void *)((long)pvVar35 +
                              (long)*(int *)((long)&pMVar15->data + lVar11) * uVar4 * 4);
            uVar12 = uVar12 + 1;
            pMVar15 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            lVar11 = lVar11 + 0x48;
          } while (uVar12 < (ulong)(((long)pMVar8 - (long)pMVar15 >> 3) * -0x71c71c71c71c71c7));
        }
        uVar5 = uVar5 + 1;
        pMVar7 = pMVar8;
        pMVar8 = pMVar15;
      } while (uVar5 != uVar10);
    }
  }
  if (uVar1 == 3 && iVar9 == 0) {
    pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar5 = ((long)pMVar8 - (long)pMVar7 >> 3) * -0x71c71c71c71c71c7;
    if (pMVar8 != pMVar7) {
      iVar32 = src->c;
      iVar18 = src->w;
      iVar22 = src->h;
      lVar34 = 0;
      lVar11 = 0;
      uVar12 = 0;
      iVar19 = 0;
      do {
        uVar10 = *(uint *)(lVar20 + uVar12 * 4);
        uVar38 = (ulong)uVar10;
        if (uVar10 == 0xffffff17) {
          uVar38 = (ulong)(long)(iVar32 * _elempack - iVar19) / (uVar5 + lVar11);
        }
        lVar27 = 1;
        if ((opt->use_packing_layout == true) &&
           (lVar27 = (ulong)((uVar38 & 3) == 0) * 3 + 1, (uVar38 & 7) == 0)) {
          lVar27 = 8;
        }
        Mat::create((Mat *)((long)&pMVar7->data + lVar34),iVar18,iVar22,
                    (int)((long)((ulong)(uint)((int)uVar38 >> 0x1f) << 0x20 | uVar38 & 0xffffffff) /
                         (long)(int)lVar27),lVar27 * (_elemsize / uVar4),(int)lVar27,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar7->data + lVar34) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar7->c + lVar34) * *(long *)((long)&pMVar7->cstep + lVar34) ==
            0) {
          return -100;
        }
        iVar19 = iVar19 + (int)uVar38;
        uVar12 = uVar12 + 1;
        pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        uVar5 = ((long)pMVar8 - (long)pMVar7 >> 3) * -0x71c71c71c71c71c7;
        lVar11 = lVar11 + -1;
        lVar34 = lVar34 + 0x48;
      } while (uVar12 < uVar5);
    }
    iVar32 = pMVar7->elempack;
    if (pMVar8 != pMVar7) {
      lVar11 = uVar5 + (uVar5 == 0);
      piVar36 = &pMVar7->elempack;
      do {
        if (*piVar36 < iVar32) {
          iVar32 = *piVar36;
        }
        piVar36 = piVar36 + 0x12;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
    }
    piVar36 = src->refcount;
    local_c8._0_8_ = src->data;
    local_c8._8_8_ = src->refcount;
    local_c8._16_8_ = src->elemsize;
    local_c8._24_4_ = src->elempack;
    local_c8._32_8_ = src->allocator;
    local_c8._40_4_ = src->dims;
    local_c8._44_4_ = src->w;
    local_c8._48_4_ = src->h;
    local_c8._52_4_ = src->d;
    local_90 = src->c;
    local_88 = src->cstep;
    if (piVar36 != (int *)0x0) {
      LOCK();
      *piVar36 = *piVar36 + 1;
      UNLOCK();
    }
    if (iVar32 < _elempack) {
      convert_packing(src,(Mat *)local_c8,iVar32,opt);
    }
    pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pMVar8 != pMVar7) {
      uVar12 = 0;
      uVar5 = 0;
      do {
        pMVar15 = pMVar7 + uVar12;
        iVar18 = pMVar15->elempack;
        if ((iVar32 == 4) && (iVar18 == 8)) {
          iVar18 = pMVar15->c;
          if (0 < (long)iVar18) {
            iVar22 = pMVar15->h * pMVar15->w;
            pvVar35 = pMVar15->data;
            sVar2 = pMVar15->cstep;
            sVar3 = pMVar15->elemsize;
            lVar11 = local_88 * local_c8._16_8_;
            uVar5 = (ulong)(int)uVar5;
            pvVar24 = (void *)((uVar5 + 1) * lVar11 + local_c8._0_8_);
            pvVar13 = (void *)(lVar11 * uVar5 + local_c8._0_8_);
            lVar34 = 0;
            do {
              if (0 < iVar22) {
                lVar27 = 0;
                iVar19 = iVar22;
                do {
                  *(undefined4 *)((long)pvVar35 + lVar27 * 2) =
                       *(undefined4 *)((long)pvVar13 + lVar27);
                  *(undefined4 *)((long)pvVar35 + lVar27 * 2 + 4) =
                       *(undefined4 *)((long)pvVar13 + lVar27 + 4);
                  *(undefined4 *)((long)pvVar35 + lVar27 * 2 + 8) =
                       *(undefined4 *)((long)pvVar13 + lVar27 + 8);
                  *(undefined4 *)((long)pvVar35 + lVar27 * 2 + 0xc) =
                       *(undefined4 *)((long)pvVar13 + lVar27 + 0xc);
                  *(undefined4 *)((long)pvVar35 + lVar27 * 2 + 0x10) =
                       *(undefined4 *)((long)pvVar24 + lVar27);
                  *(undefined4 *)((long)pvVar35 + lVar27 * 2 + 0x14) =
                       *(undefined4 *)((long)pvVar24 + lVar27 + 4);
                  *(undefined4 *)((long)pvVar35 + lVar27 * 2 + 0x18) =
                       *(undefined4 *)((long)pvVar24 + lVar27 + 8);
                  *(undefined4 *)((long)pvVar35 + lVar27 * 2 + 0x1c) =
                       *(undefined4 *)((long)pvVar24 + lVar27 + 0xc);
                  lVar27 = lVar27 + 0x10;
                  iVar19 = iVar19 + -1;
                } while (iVar19 != 0);
              }
              uVar5 = uVar5 + 2;
              lVar34 = lVar34 + 1;
              pvVar35 = (void *)((long)pvVar35 + sVar2 * sVar3);
              pvVar24 = (void *)((long)pvVar24 + lVar11 * 2);
              pvVar13 = (void *)((long)pvVar13 + lVar11 * 2);
            } while (lVar34 != iVar18);
            iVar18 = pMVar15->elempack;
            goto LAB_00365ad2;
          }
LAB_00365d7b:
          iVar18 = 8;
        }
        else {
LAB_00365ad2:
          if ((iVar32 == 1) && (iVar18 == 8)) {
            iVar18 = pMVar15->c;
            if ((long)iVar18 < 1) goto LAB_00365d7b;
            iVar22 = pMVar15->h * pMVar15->w;
            pvVar35 = pMVar15->data;
            sVar2 = pMVar15->cstep;
            sVar3 = pMVar15->elemsize;
            uVar5 = (ulong)(int)uVar5;
            lVar34 = local_88 * local_c8._16_8_;
            pvVar30 = (void *)((uVar5 + 7) * lVar34 + local_c8._0_8_);
            lVar11 = lVar34 * 8;
            pvVar24 = (void *)((uVar5 + 6) * lVar34 + local_c8._0_8_);
            pvVar40 = (void *)((uVar5 + 5) * lVar34 + local_c8._0_8_);
            pvVar13 = (void *)((uVar5 + 4) * lVar34 + local_c8._0_8_);
            pvVar21 = (void *)((uVar5 + 3) * lVar34 + local_c8._0_8_);
            pvVar37 = (void *)((uVar5 + 2) * lVar34 + local_c8._0_8_);
            pvVar17 = (void *)((uVar5 + 1) * lVar34 + local_c8._0_8_);
            pvVar25 = (void *)(lVar34 * uVar5 + local_c8._0_8_);
            lVar34 = 0;
            do {
              if (0 < iVar22) {
                lVar27 = 0;
                iVar19 = iVar22;
                do {
                  *(undefined4 *)((long)pvVar35 + lVar27 * 8) =
                       *(undefined4 *)((long)pvVar25 + lVar27);
                  *(undefined4 *)((long)pvVar35 + lVar27 * 8 + 4) =
                       *(undefined4 *)((long)pvVar17 + lVar27);
                  *(undefined4 *)((long)pvVar35 + lVar27 * 8 + 8) =
                       *(undefined4 *)((long)pvVar37 + lVar27);
                  *(undefined4 *)((long)pvVar35 + lVar27 * 8 + 0xc) =
                       *(undefined4 *)((long)pvVar21 + lVar27);
                  *(undefined4 *)((long)pvVar35 + lVar27 * 8 + 0x10) =
                       *(undefined4 *)((long)pvVar13 + lVar27);
                  *(undefined4 *)((long)pvVar35 + lVar27 * 8 + 0x14) =
                       *(undefined4 *)((long)pvVar40 + lVar27);
                  *(undefined4 *)((long)pvVar35 + lVar27 * 8 + 0x18) =
                       *(undefined4 *)((long)pvVar24 + lVar27);
                  *(undefined4 *)((long)pvVar35 + lVar27 * 8 + 0x1c) =
                       *(undefined4 *)((long)pvVar30 + lVar27);
                  lVar27 = lVar27 + 4;
                  iVar19 = iVar19 + -1;
                } while (iVar19 != 0);
              }
              uVar5 = uVar5 + 8;
              lVar34 = lVar34 + 1;
              pvVar35 = (void *)((long)pvVar35 + sVar2 * sVar3);
              pvVar30 = (void *)((long)pvVar30 + lVar11);
              pvVar24 = (void *)((long)pvVar24 + lVar11);
              pvVar40 = (void *)((long)pvVar40 + lVar11);
              pvVar13 = (void *)((long)pvVar13 + lVar11);
              pvVar21 = (void *)((long)pvVar21 + lVar11);
              pvVar37 = (void *)((long)pvVar37 + lVar11);
              pvVar17 = (void *)((long)pvVar17 + lVar11);
              pvVar25 = (void *)((long)pvVar25 + lVar11);
            } while (lVar34 != iVar18);
            iVar18 = pMVar15->elempack;
          }
          if ((iVar32 == 1) && (iVar18 == 4)) {
            iVar22 = pMVar15->c;
            if ((long)iVar22 < 1) {
              iVar18 = 4;
            }
            else {
              iVar19 = pMVar15->h * pMVar15->w;
              pvVar35 = pMVar15->data;
              sVar2 = pMVar15->cstep;
              sVar3 = pMVar15->elemsize;
              uVar5 = (ulong)(int)uVar5;
              lVar34 = local_88 * local_c8._16_8_;
              pvVar24 = (void *)((uVar5 + 3) * lVar34 + local_c8._0_8_);
              lVar11 = lVar34 * 4;
              pvVar17 = (void *)((uVar5 + 2) * lVar34 + local_c8._0_8_);
              pvVar21 = (void *)((uVar5 + 1) * lVar34 + local_c8._0_8_);
              pvVar13 = (void *)(lVar34 * uVar5 + local_c8._0_8_);
              lVar34 = 0;
              do {
                if (0 < iVar19) {
                  puVar31 = (undefined4 *)(sVar2 * sVar3 * lVar34 + (long)pvVar35);
                  lVar27 = 0;
                  do {
                    *puVar31 = *(undefined4 *)((long)pvVar13 + lVar27 * 4);
                    puVar31[1] = *(undefined4 *)((long)pvVar21 + lVar27 * 4);
                    puVar31[2] = *(undefined4 *)((long)pvVar17 + lVar27 * 4);
                    puVar31[3] = *(undefined4 *)((long)pvVar24 + lVar27 * 4);
                    puVar31 = puVar31 + 4;
                    lVar27 = lVar27 + 1;
                  } while (iVar19 != (int)lVar27);
                }
                uVar5 = uVar5 + 4;
                lVar34 = lVar34 + 1;
                pvVar24 = (void *)((long)pvVar24 + lVar11);
                pvVar17 = (void *)((long)pvVar17 + lVar11);
                pvVar21 = (void *)((long)pvVar21 + lVar11);
                pvVar13 = (void *)((long)pvVar13 + lVar11);
              } while (lVar34 != iVar22);
            }
          }
        }
        if (iVar32 == iVar18) {
          memcpy(pMVar15->data,
                 (void *)(local_88 * (long)(int)uVar5 * local_c8._16_8_ + local_c8._0_8_),
                 (long)((int)pMVar15->cstep * pMVar15->c) * pMVar15->elemsize);
          uVar5 = (ulong)(uint)((int)uVar5 + pMVar15->c);
          pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < (ulong)(((long)pMVar8 - (long)pMVar7 >> 3) * -0x71c71c71c71c71c7));
    }
    if ((int *)local_c8._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_c8._8_8_ = *(int *)local_c8._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_c8._8_8_ == 0) {
        if ((Allocator *)local_c8._32_8_ == (Allocator *)0x0) {
          if ((void *)local_c8._0_8_ != (void *)0x0) {
            free((void *)local_c8._0_8_);
          }
        }
        else {
          (*(*(_func_int ***)local_c8._32_8_)[3])();
        }
      }
    }
  }
  if ((uVar1 == 3) && (iVar9 == 1)) {
    uVar10 = src->c;
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)pMVar7 - (long)pMVar8 != 0) {
      iVar32 = src->w;
      iVar18 = src->h;
      uVar5 = ((long)pMVar7 - (long)pMVar8 >> 3) * -0x71c71c71c71c71c7;
      lVar34 = 0;
      lVar11 = 0;
      uVar12 = 0;
      iVar22 = 0;
      do {
        iVar19 = *(int *)(lVar20 + uVar12 * 4);
        if (iVar19 == -0xe9) {
          iVar19 = (int)((ulong)((long)iVar18 - (long)iVar22) / (uVar5 + lVar11));
        }
        Mat::create((Mat *)((long)&pMVar8->data + lVar34),iVar32,iVar19,uVar10,_elemsize,_elempack,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar8->data + lVar34) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar8->c + lVar34) * *(long *)((long)&pMVar8->cstep + lVar34) ==
            0) {
          return -100;
        }
        iVar22 = iVar22 + iVar19;
        uVar12 = uVar12 + 1;
        pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        uVar5 = ((long)pMVar7 - (long)pMVar8 >> 3) * -0x71c71c71c71c71c7;
        lVar11 = lVar11 + -1;
        lVar34 = lVar34 + 0x48;
      } while (uVar12 < uVar5);
    }
    if (0 < (int)uVar10) {
      uVar5 = 0;
      do {
        pMVar15 = pMVar8;
        if (pMVar7 != pMVar8) {
          pvVar35 = (void *)(src->cstep * uVar5 * src->elemsize + (long)src->data);
          lVar11 = 0x40;
          uVar12 = 0;
          do {
            lVar34 = (long)*(int *)((long)pMVar15 + lVar11 + -0x10) *
                     (long)*(int *)((long)pMVar15 + lVar11 + -0x14);
            memcpy((void *)(*(long *)((long)&pMVar15->data + lVar11) * uVar5 *
                            *(long *)((long)pMVar15 + lVar11 + -0x30) +
                           *(long *)((long)pMVar15 + lVar11 + -0x40)),pvVar35,lVar34 * _elemsize);
            pvVar35 = (void *)((long)pvVar35 + (long)((int)lVar34 * _elempack) * 4);
            uVar12 = uVar12 + 1;
            pMVar15 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            lVar11 = lVar11 + 0x48;
          } while (uVar12 < (ulong)(((long)pMVar8 - (long)pMVar15 >> 3) * -0x71c71c71c71c71c7));
        }
        uVar5 = uVar5 + 1;
        pMVar7 = pMVar8;
        pMVar8 = pMVar15;
      } while (uVar5 != uVar10);
    }
  }
  if ((uVar1 == 3) && (iVar9 == 2)) {
    uVar1 = src->h;
    uVar10 = src->c;
    pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)pMVar8 - (long)pMVar7 != 0) {
      iVar9 = src->w;
      uVar5 = ((long)pMVar8 - (long)pMVar7 >> 3) * -0x71c71c71c71c71c7;
      lVar34 = 0;
      lVar11 = 0;
      uVar12 = 0;
      iVar32 = 0;
      do {
        iVar18 = *(int *)(lVar20 + uVar12 * 4);
        if (iVar18 == -0xe9) {
          iVar18 = (int)((ulong)((long)iVar9 - (long)iVar32) / (uVar5 + lVar11));
        }
        Mat::create((Mat *)((long)&pMVar7->data + lVar34),iVar18,uVar1,uVar10,_elemsize,_elempack,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar7->data + lVar34) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar7->c + lVar34) * *(long *)((long)&pMVar7->cstep + lVar34) ==
            0) {
          return -100;
        }
        iVar32 = iVar32 + iVar18;
        uVar12 = uVar12 + 1;
        pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        uVar5 = ((long)pMVar8 - (long)pMVar7 >> 3) * -0x71c71c71c71c71c7;
        lVar11 = lVar11 + -1;
        lVar34 = lVar34 + 0x48;
      } while (uVar12 < uVar5);
    }
    if (0 < (int)uVar10) {
      uVar5 = 0;
      do {
        if (0 < (int)uVar1) {
          pvVar35 = (void *)(src->cstep * uVar5 * src->elemsize + (long)src->data);
          uVar12 = 0;
          pMVar15 = pMVar8;
          do {
            pMVar8 = pMVar7;
            pMVar7 = pMVar8;
            if (pMVar15 != pMVar8) {
              lVar20 = 0x40;
              uVar38 = 0;
              do {
                lVar34 = (long)*(int *)((long)pMVar7 + lVar20 + -0x14);
                lVar11 = *(long *)((long)pMVar7 + lVar20 + -0x30);
                memcpy((void *)(uVar12 * lVar34 * lVar11 +
                               *(long *)((long)&pMVar7->data + lVar20) * uVar5 * lVar11 +
                               *(long *)((long)pMVar7 + lVar20 + -0x40)),pvVar35,lVar34 * _elemsize)
                ;
                pvVar35 = (void *)((long)pvVar35 +
                                  (long)*(int *)((long)pMVar7 + lVar20 + -0x14) * uVar4 * 4);
                uVar38 = uVar38 + 1;
                pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_finish;
                lVar20 = lVar20 + 0x48;
              } while (uVar38 < (ulong)(((long)pMVar8 - (long)pMVar7 >> 3) * -0x71c71c71c71c71c7));
            }
            uVar12 = uVar12 + 1;
            pMVar15 = pMVar8;
          } while (uVar12 != uVar1);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar10);
    }
  }
  return 0;
}

Assistant:

int Slice_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    const int* slices_ptr = slices;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // slice vector
        int w = bottom_blob.w * elempack;
        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX512F__
                out_elempack = slice % 16 == 0 ? 16 : slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#elif __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const float* ptr = (const float*)bottom_blob + q;
            float* outptr = top_blob;
            memcpy(outptr, ptr, top_blob.w * top_blob.elemsize);

            q += slice;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // slice image height
        int w = bottom_blob.w;
        int h = bottom_blob.h * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX512F__
                out_elempack = slice % 16 == 0 ? 16 : slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#elif __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        const float* ptr = bottom_blob_unpacked;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 8 && top_blob.elempack == 16)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 8;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr0[8] = r1[0];
                        outptr0[9] = r1[1];
                        outptr0[10] = r1[2];
                        outptr0[11] = r1[3];
                        outptr0[12] = r1[4];
                        outptr0[13] = r1[5];
                        outptr0[14] = r1[6];
                        outptr0[15] = r1[7];

                        r0 += 8;
                        r1 += 8;
                        outptr0 += 16;
                    }

                    ptr += w * 16;
                }
            }
            if (out_elempack == 4 && top_blob.elempack == 16)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 4;
                    const float* r2 = ptr + w * 8;
                    const float* r3 = ptr + w * 12;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];
                        outptr0[8] = r2[0];
                        outptr0[9] = r2[1];
                        outptr0[10] = r2[2];
                        outptr0[11] = r2[3];
                        outptr0[12] = r3[0];
                        outptr0[13] = r3[1];
                        outptr0[14] = r3[2];
                        outptr0[15] = r3[3];

                        r0 += 4;
                        r1 += 4;
                        r2 += 4;
                        r3 += 4;
                        outptr0 += 16;
                    }

                    ptr += w * 16;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 16)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;
                    const float* r4 = ptr + w * 4;
                    const float* r5 = ptr + w * 5;
                    const float* r6 = ptr + w * 6;
                    const float* r7 = ptr + w * 7;
                    const float* r8 = ptr + w * 8;
                    const float* r9 = ptr + w * 9;
                    const float* ra = ptr + w * 10;
                    const float* rb = ptr + w * 11;
                    const float* rc = ptr + w * 12;
                    const float* rd = ptr + w * 13;
                    const float* re = ptr + w * 14;
                    const float* rf = ptr + w * 15;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;
                        outptr0[8] = *r8++;
                        outptr0[9] = *r9++;
                        outptr0[10] = *ra++;
                        outptr0[11] = *rb++;
                        outptr0[12] = *rc++;
                        outptr0[13] = *rd++;
                        outptr0[14] = *re++;
                        outptr0[15] = *rf++;

                        outptr0 += 16;
                    }

                    ptr += w * 16;
                }
            }
#endif // __AVX512F__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 4;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;
                    const float* r4 = ptr + w * 4;
                    const float* r5 = ptr + w * 5;
                    const float* r6 = ptr + w * 6;
                    const float* r7 = ptr + w * 7;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    ptr += w * 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = w * top_blob.h;

                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                ptr += size * top_blob.elempack;
            }
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // slice image width
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int j = 0; j < h; j++)
        {
            const float* ptr = bottom_blob.row<const float>(j);
            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                float* outptr = top_blob.row(j);
                memcpy(outptr, ptr, top_blob.w * elemsize);

                ptr += top_blob.w * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 0)
    {
        // slice dim channel
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (channels - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX512F__
                out_elempack = slice % 16 == 0 ? 16 : slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#elif __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        int p = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 8 && top_blob.elempack == 16)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr0[8] = r1[0];
                        outptr0[9] = r1[1];
                        outptr0[10] = r1[2];
                        outptr0[11] = r1[3];
                        outptr0[12] = r1[4];
                        outptr0[13] = r1[5];
                        outptr0[14] = r1[6];
                        outptr0[15] = r1[7];

                        r0 += 8;
                        r1 += 8;
                        outptr0 += 16;
                    }

                    p += 2;
                }
            }
            if (out_elempack == 4 && top_blob.elempack == 16)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];
                        outptr0[8] = r2[0];
                        outptr0[9] = r2[1];
                        outptr0[10] = r2[2];
                        outptr0[11] = r2[3];
                        outptr0[12] = r3[0];
                        outptr0[13] = r3[1];
                        outptr0[14] = r3[2];
                        outptr0[15] = r3[3];

                        r0 += 4;
                        r1 += 4;
                        r2 += 4;
                        r3 += 4;
                        outptr0 += 16;
                    }

                    p += 4;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 16)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);
                    const float* r4 = bottom_blob_unpacked.channel(p + 4);
                    const float* r5 = bottom_blob_unpacked.channel(p + 5);
                    const float* r6 = bottom_blob_unpacked.channel(p + 6);
                    const float* r7 = bottom_blob_unpacked.channel(p + 7);
                    const float* r8 = bottom_blob_unpacked.channel(p + 8);
                    const float* r9 = bottom_blob_unpacked.channel(p + 9);
                    const float* ra = bottom_blob_unpacked.channel(p + 10);
                    const float* rb = bottom_blob_unpacked.channel(p + 11);
                    const float* rc = bottom_blob_unpacked.channel(p + 12);
                    const float* rd = bottom_blob_unpacked.channel(p + 13);
                    const float* re = bottom_blob_unpacked.channel(p + 14);
                    const float* rf = bottom_blob_unpacked.channel(p + 15);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;
                        outptr0[8] = *r8++;
                        outptr0[9] = *r9++;
                        outptr0[10] = *ra++;
                        outptr0[11] = *rb++;
                        outptr0[12] = *rc++;
                        outptr0[13] = *rd++;
                        outptr0[14] = *re++;
                        outptr0[15] = *rf++;

                        outptr0 += 16;
                    }

                    p += 16;
                }
            }
#endif // __AVX512F__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    p += 2;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);
                    const float* r4 = bottom_blob_unpacked.channel(p + 4);
                    const float* r5 = bottom_blob_unpacked.channel(p + 5);
                    const float* r6 = bottom_blob_unpacked.channel(p + 6);
                    const float* r7 = bottom_blob_unpacked.channel(p + 7);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    p += 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    p += 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = top_blob.total();

                const float* ptr = bottom_blob_unpacked.channel(p);
                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                p += top_blob.c;
            }
        }
    }

    if (dims == 3 && positive_axis == 1)
    {
        // slice dim height
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                int size = top_blob.w * top_blob.h;

                float* outptr = top_blob.channel(p);
                memcpy(outptr, ptr, size * elemsize);

                ptr += size * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        // slice dim width
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (int j = 0; j < h; j++)
            {
                for (size_t i = 0; i < top_blobs.size(); i++)
                {
                    Mat& top_blob = top_blobs[i];

                    float* outptr = top_blob.channel(p).row(j);
                    memcpy(outptr, ptr, top_blob.w * elemsize);

                    ptr += top_blob.w * elempack;
                }
            }
        }
    }

    return 0;
}